

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

pair<llvm::StringMapIterator<unsigned_short>,_bool> __thiscall
llvm::StringMap<unsigned_short,_llvm::MallocAllocator>::try_emplace<>
          (StringMap<unsigned_short,_llvm::MallocAllocator> *this,StringRef Key)

{
  StringMapEntryBase **ppSVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  StringMapEntryBase *pSVar5;
  size_t __n;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
  SVar7;
  size_t KeyLength;
  pair<llvm::StringMapIterator<unsigned_short>,_bool> pVar8;
  
  __n = Key.Length;
  uVar3 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  SVar7.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
  pSVar5 = *SVar7.Ptr;
  if (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar2 = &(this->super_StringMapImpl).NumTombstones;
    *puVar2 = *puVar2 - 1;
  }
  else if (pSVar5 != (StringMapEntryBase *)0x0) {
    while ((pSVar5 == (StringMapEntryBase *)0x0 ||
           (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8))) {
      ppSVar1 = SVar7.Ptr + 1;
      SVar7.Ptr = SVar7.Ptr + 1;
      pSVar5 = *ppSVar1;
    }
    uVar6 = 0;
    goto LAB_00d87bc7;
  }
  pSVar5 = (StringMapEntryBase *)
           MallocAllocator::Allocate((MallocAllocator *)&this->field_0x18,__n + 0x11,8);
  pSVar5->StrLen = __n;
  *(undefined2 *)&pSVar5[1].StrLen = 0;
  if (__n != 0) {
    memcpy(pSVar5 + 2,Key.Data,__n);
  }
  *(undefined1 *)((long)&pSVar5[2].StrLen + __n) = 0;
  *SVar7.Ptr = pSVar5;
  uVar4 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar4;
  if ((this->super_StringMapImpl).NumBuckets < uVar4 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringMap.h"
                  ,0x1bb,
                  "std::pair<iterator, bool> llvm::StringMap<unsigned short>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = unsigned short, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar3 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar3);
  for (SVar7.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
      (*SVar7.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar7.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar7.Ptr = SVar7.Ptr + 1) {
  }
  uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00d87bc7:
  pVar8._8_8_ = uVar6;
  pVar8.first.
  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
          )(StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
            )SVar7.Ptr;
  return pVar8;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }